

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_from_bytes(uint64_t *out1,uint8_t *arg1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar1 = arg1[0x1f];
  bVar2 = arg1[0x1e];
  bVar3 = arg1[0x1d];
  bVar4 = arg1[0x1c];
  bVar5 = arg1[0x1b];
  bVar6 = arg1[0x1a];
  uVar9 = ((ulong)*arg1 |
           (ulong)arg1[2] << 0x10 |
           (ulong)arg1[3] << 0x18 | (ulong)arg1[4] << 0x20 | (ulong)arg1[5] << 0x28 |
          (ulong)arg1[1] << 8) + ((ulong)arg1[6] << 0x30);
  uVar10 = (uVar9 >> 0x34) +
           ((ulong)arg1[7] << 4 |
           (ulong)arg1[8] << 0xc |
           (ulong)arg1[9] << 0x14 |
           (ulong)arg1[10] << 0x1c | (ulong)arg1[0xb] << 0x24 | (ulong)arg1[0xc] << 0x2c);
  uVar7 = ((ulong)arg1[0xe] << 9 |
          (ulong)arg1[0xf] << 0x11 |
          (ulong)arg1[0x10] << 0x19 |
          (ulong)arg1[0x11] << 0x21 | (ulong)arg1[0x12] << 0x29 | (ulong)arg1[0x13] << 0x31) +
          (ulong)arg1[0xd] * 2 + (uVar10 >> 0x33);
  uVar8 = (uVar7 >> 0x33) +
          ((ulong)arg1[0x14] << 6 |
          (ulong)arg1[0x15] << 0xe |
          (ulong)arg1[0x16] << 0x16 |
          (ulong)arg1[0x17] << 0x1e | (ulong)arg1[0x18] << 0x26 | (ulong)arg1[0x19] << 0x2e);
  *out1 = uVar9 & 0xfffffffffffff;
  out1[1] = uVar10 & 0x7ffffffffffff;
  out1[2] = uVar7 & 0x7ffffffffffff;
  out1[3] = uVar8 & 0x7ffffffffffff;
  out1[4] = ((ulong)bVar5 << 0xb |
            (ulong)bVar4 << 0x13 |
            (ulong)bVar3 << 0x1b | (ulong)bVar2 << 0x23 | (ulong)bVar1 << 0x2b) + (ulong)bVar6 * 8 +
            (uVar8 >> 0x33);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_from_bytes(
    uint64_t out1[5], const uint8_t arg1[32]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint8_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1 x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    uint64_t x56;
    uint8_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint8_t x65;
    uint64_t x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    x1 = ((uint64_t)(arg1[31]) << 43);
    x2 = ((uint64_t)(arg1[30]) << 35);
    x3 = ((uint64_t)(arg1[29]) << 27);
    x4 = ((uint64_t)(arg1[28]) << 19);
    x5 = ((uint64_t)(arg1[27]) << 11);
    x6 = ((uint64_t)(arg1[26]) << 3);
    x7 = ((uint64_t)(arg1[25]) << 46);
    x8 = ((uint64_t)(arg1[24]) << 38);
    x9 = ((uint64_t)(arg1[23]) << 30);
    x10 = ((uint64_t)(arg1[22]) << 22);
    x11 = ((uint64_t)(arg1[21]) << 14);
    x12 = ((uint64_t)(arg1[20]) << 6);
    x13 = ((uint64_t)(arg1[19]) << 49);
    x14 = ((uint64_t)(arg1[18]) << 41);
    x15 = ((uint64_t)(arg1[17]) << 33);
    x16 = ((uint64_t)(arg1[16]) << 25);
    x17 = ((uint64_t)(arg1[15]) << 17);
    x18 = ((uint64_t)(arg1[14]) << 9);
    x19 = ((uint64_t)(arg1[13]) * 0x2);
    x20 = ((uint64_t)(arg1[12]) << 44);
    x21 = ((uint64_t)(arg1[11]) << 36);
    x22 = ((uint64_t)(arg1[10]) << 28);
    x23 = ((uint64_t)(arg1[9]) << 20);
    x24 = ((uint64_t)(arg1[8]) << 12);
    x25 = ((uint64_t)(arg1[7]) << 4);
    x26 = ((uint64_t)(arg1[6]) << 48);
    x27 = ((uint64_t)(arg1[5]) << 40);
    x28 = ((uint64_t)(arg1[4]) << 32);
    x29 = ((uint64_t)(arg1[3]) << 24);
    x30 = ((uint64_t)(arg1[2]) << 16);
    x31 = ((uint64_t)(arg1[1]) << 8);
    x32 = (arg1[0]);
    x33 = (x31 + (uint64_t)x32);
    x34 = (x30 + x33);
    x35 = (x29 + x34);
    x36 = (x28 + x35);
    x37 = (x27 + x36);
    x38 = (x26 + x37);
    x39 = (x38 & UINT64_C(0xfffffffffffff));
    x40 = (uint8_t)(x38 >> 52);
    x41 = (x25 + (uint64_t)x40);
    x42 = (x24 + x41);
    x43 = (x23 + x42);
    x44 = (x22 + x43);
    x45 = (x21 + x44);
    x46 = (x20 + x45);
    x47 = (x46 & UINT64_C(0x7ffffffffffff));
    x48 = (fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_uint1)(x46 >> 51);
    x49 = (x19 + (uint64_t)x48);
    x50 = (x18 + x49);
    x51 = (x17 + x50);
    x52 = (x16 + x51);
    x53 = (x15 + x52);
    x54 = (x14 + x53);
    x55 = (x13 + x54);
    x56 = (x55 & UINT64_C(0x7ffffffffffff));
    x57 = (uint8_t)(x55 >> 51);
    x58 = (x12 + (uint64_t)x57);
    x59 = (x11 + x58);
    x60 = (x10 + x59);
    x61 = (x9 + x60);
    x62 = (x8 + x61);
    x63 = (x7 + x62);
    x64 = (x63 & UINT64_C(0x7ffffffffffff));
    x65 = (uint8_t)(x63 >> 51);
    x66 = (x6 + (uint64_t)x65);
    x67 = (x5 + x66);
    x68 = (x4 + x67);
    x69 = (x3 + x68);
    x70 = (x2 + x69);
    x71 = (x1 + x70);
    out1[0] = x39;
    out1[1] = x47;
    out1[2] = x56;
    out1[3] = x64;
    out1[4] = x71;
}